

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O1

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuLayoutItem> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  QDBusMenuLayoutItem item;
  undefined1 *local_68;
  QVariantMap QStack_60;
  QArrayDataPointer<QDBusMenuLayoutItem> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuLayoutItem>::clear(list);
  cVar1 = QDBusArgument::atEnd();
  if (cVar1 == '\0') {
    do {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QDBusMenuLayoutItem *)0x0;
      local_58.size = 0;
      QStack_60.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
            )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
              )0x0;
      local_58.d = (Data *)0x0;
      operator>>(arg,(QDBusMenuLayoutItem *)&local_68);
      QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
                ((QMovableArrayOps<QDBusMenuLayoutItem> *)list,(list->d).size,
                 (QDBusMenuLayoutItem *)&local_68);
      QList<QDBusMenuLayoutItem>::end(list);
      QArrayDataPointer<QDBusMenuLayoutItem>::~QArrayDataPointer(&local_58);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&QStack_60.d);
      cVar1 = QDBusArgument::atEnd();
    } while (cVar1 == '\0');
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}